

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O1

void __thiscall
avro::
NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::setLeafToSymbolic(NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                    *this,int index,NodePtr *node)

{
  element_type *peVar1;
  sp_counted_base *psVar2;
  bool bVar3;
  int iVar4;
  Name *this_00;
  undefined4 extraout_var;
  NodeSymbolic *p;
  undefined4 extraout_var_00;
  undefined8 *puVar5;
  pointer psVar6;
  ulong uVar7;
  NodePtr symbol;
  shared_ptr<avro::Node> local_50;
  element_type local_40;
  
  uVar7 = (ulong)index;
  psVar6 = (this->leafAttributes_).attrs_.
           super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->leafAttributes_).attrs_.
                    super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4) <= uVar7) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
  }
  this_00 = (Name *)(**(code **)((long)(psVar6[uVar7].px)->_vptr_Node + 0x18))();
  iVar4 = (*node->px->_vptr_Node[3])();
  bVar3 = Name::operator==(this_00,(Name *)CONCAT44(extraout_var,iVar4));
  if (bVar3) {
    p = (NodeSymbolic *)operator_new(0x68);
    (p->super_NodeImplSymbolic).super_Node.type_ = AVRO_NUM_TYPES;
    (p->super_NodeImplSymbolic).super_Node.locked_ = false;
    (p->super_NodeImplSymbolic).nameAttribute_.attr_.ns_._M_dataplus._M_p =
         (pointer)&(p->super_NodeImplSymbolic).nameAttribute_.attr_.ns_.field_2;
    (p->super_NodeImplSymbolic).nameAttribute_.attr_.ns_._M_string_length = 0;
    (p->super_NodeImplSymbolic).nameAttribute_.attr_.ns_.field_2._M_local_buf[0] = '\0';
    (p->super_NodeImplSymbolic).nameAttribute_.attr_.simpleName_._M_dataplus._M_p =
         (pointer)&(p->super_NodeImplSymbolic).nameAttribute_.attr_.simpleName_.field_2;
    (p->super_NodeImplSymbolic).nameAttribute_.attr_.simpleName_._M_string_length = 0;
    (p->super_NodeImplSymbolic).nameAttribute_.attr_.simpleName_.field_2._M_local_buf[0] = '\0';
    (p->super_NodeImplSymbolic).super_Node._vptr_Node = (_func_int **)&PTR__NodeSymbolic_001cea20;
    (p->actualNode_).px = (element_type *)0x0;
    (p->actualNode_).pn.pi_ = (sp_counted_base *)0x0;
    boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeSymbolic>(&local_50,p);
    peVar1 = local_50.px;
    iVar4 = (*node->px->_vptr_Node[3])();
    Node::checkLock(peVar1);
    (*peVar1->_vptr_Node[0x10])(peVar1,CONCAT44(extraout_var_00,iVar4));
    (*peVar1->_vptr_Node[0x11])(peVar1,CONCAT44(extraout_var_00,iVar4));
    psVar6 = psVar6 + uVar7;
    *(element_type **)&peVar1[5].type_ = node->px;
    boost::detail::weak_count::operator=((weak_count *)(peVar1 + 6),&node->pn);
    peVar1 = psVar6->px;
    psVar6->px = local_50.px;
    psVar2 = (psVar6->pn).pi_;
    (psVar6->pn).pi_ = local_50.pn.pi_;
    local_50.px = peVar1;
    local_50.pn.pi_ = psVar2;
    boost::detail::shared_count::~shared_count(&local_50.pn);
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_50.px = &local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Symbolic name does not match the name of the schema it references"
             ,"");
  std::runtime_error::runtime_error((runtime_error *)(puVar5 + 1),(string *)&local_50);
  *puVar5 = 0x1cd6f0;
  puVar5[1] = 0x1cd720;
  __cxa_throw(puVar5,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void 
NodeImpl<A,B,C,D>::setLeafToSymbolic(int index, const NodePtr &node)
{
    if(!B::hasAttribute) {
        throw Exception("Cannot change leaf node for nonexistent leaf");
    } 

    NodePtr &replaceNode = const_cast<NodePtr &>(leafAttributes_.get(index));
    if(replaceNode->name() != node->name()) {
        throw Exception("Symbolic name does not match the name of the schema it references");
    }

    NodePtr symbol(new NodeSymbolic);
    NodeSymbolic *ptr = static_cast<NodeSymbolic *> (symbol.get());

    ptr->setName(node->name());
    ptr->setNode(node);
    replaceNode.swap(symbol);
}